

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

CScriptCheck * __thiscall CScriptCheck::operator=(CScriptCheck *this,CScriptCheck *param_1)

{
  long lVar1;
  CTransaction *pCVar2;
  PrecomputedTransactionData *pPVar3;
  undefined3 uVar4;
  ScriptError SVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTxOut::operator=(&this->m_tx_out,&param_1->m_tx_out);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    this->m_signature_cache = param_1->m_signature_cache;
    pCVar2 = param_1->ptxTo;
    uVar6 = param_1->nIn;
    uVar7 = param_1->nFlags;
    uVar4 = *(undefined3 *)&param_1->field_0x39;
    SVar5 = param_1->error;
    pPVar3 = param_1->txdata;
    this->cacheStore = param_1->cacheStore;
    *(undefined3 *)&this->field_0x39 = uVar4;
    this->error = SVar5;
    this->txdata = pPVar3;
    this->ptxTo = pCVar2;
    this->nIn = uVar6;
    this->nFlags = uVar7;
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CScriptCheck& operator=(CScriptCheck&&) = default;